

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O0

REF_STATUS ref_dict_bcast(REF_DICT ref_dict,REF_MPI ref_mpi)

{
  uint uVar1;
  void *data;
  void *data_00;
  REF_STATUS local_68;
  REF_STATUS local_64;
  REF_STATUS local_60;
  REF_STATUS local_5c;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT value;
  REF_INT key;
  REF_INT index;
  REF_INT i;
  REF_INT *values;
  REF_INT *keys;
  REF_MPI pRStack_20;
  REF_INT n;
  REF_MPI ref_mpi_local;
  REF_DICT ref_dict_local;
  
  if (ref_mpi->n < 2) {
    ref_dict_local._4_4_ = 0;
  }
  else {
    if (ref_mpi->id == 0) {
      keys._4_4_ = ref_dict->n;
    }
    pRStack_20 = ref_mpi;
    ref_mpi_local = (REF_MPI)ref_dict;
    uVar1 = ref_mpi_bcast(ref_mpi,(void *)((long)&keys + 4),1,1);
    if (uVar1 == 0) {
      if (keys._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0xd7
               ,"ref_dict_bcast","malloc keys of REF_INT negative");
        ref_dict_local._4_4_ = 1;
      }
      else {
        data = malloc((long)keys._4_4_ << 2);
        if (data == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",
                 0xd7,"ref_dict_bcast","malloc keys of REF_INT NULL");
          ref_dict_local._4_4_ = 2;
        }
        else if (keys._4_4_ < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",
                 0xd8,"ref_dict_bcast","malloc values of REF_INT negative");
          ref_dict_local._4_4_ = 1;
        }
        else {
          data_00 = malloc((long)keys._4_4_ << 2);
          if (data_00 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",
                   0xd8,"ref_dict_bcast","malloc values of REF_INT NULL");
            ref_dict_local._4_4_ = 2;
          }
          else {
            if (pRStack_20->id == 0) {
              value = 0;
              if (ref_mpi_local->n < 1) {
                local_5c = -1;
              }
              else {
                local_5c = *ref_mpi_local->comm;
              }
              ref_private_macro_code_rss = local_5c;
              if (ref_mpi_local->n < 1) {
                local_60 = -1;
              }
              else {
                local_60 = *(REF_STATUS *)ref_mpi_local->start_time;
              }
              ref_private_macro_code_rss_1 = local_60;
              while (value < ref_mpi_local->n) {
                *(REF_STATUS *)((long)data + (long)value * 4) = ref_private_macro_code_rss;
                *(REF_STATUS *)((long)data_00 + (long)value * 4) = ref_private_macro_code_rss_1;
                value = value + 1;
                if ((value < 0) || (ref_mpi_local->n <= value)) {
                  local_64 = -1;
                }
                else {
                  local_64 = *(REF_STATUS *)((long)ref_mpi_local->comm + (long)value * 4);
                }
                ref_private_macro_code_rss = local_64;
                if ((value < 0) || (ref_mpi_local->n <= value)) {
                  local_68 = -1;
                }
                else {
                  local_68 = *(REF_STATUS *)((long)ref_mpi_local->start_time + (long)value * 4);
                }
                ref_private_macro_code_rss_1 = local_68;
              }
            }
            uVar1 = ref_mpi_bcast(pRStack_20,data,keys._4_4_,1);
            if (uVar1 == 0) {
              uVar1 = ref_mpi_bcast(pRStack_20,data_00,keys._4_4_,1);
              if (uVar1 == 0) {
                if (pRStack_20->id != 0) {
                  for (key = 0; key < keys._4_4_; key = key + 1) {
                    uVar1 = ref_dict_store((REF_DICT)ref_mpi_local,
                                           *(REF_INT *)((long)data + (long)key * 4),
                                           *(REF_INT *)((long)data_00 + (long)key * 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c"
                             ,0xe3,"ref_dict_bcast",(ulong)uVar1,"store");
                      return uVar1;
                    }
                  }
                }
                if (data_00 != (void *)0x0) {
                  free(data_00);
                }
                if (data != (void *)0x0) {
                  free(data);
                }
                ref_dict_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c"
                       ,0xe0,"ref_dict_bcast",(ulong)uVar1,"bcast values");
                ref_dict_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c"
                     ,0xdf,"ref_dict_bcast",(ulong)uVar1,"bcast keys");
              ref_dict_local._4_4_ = uVar1;
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0xd6,
             "ref_dict_bcast",(ulong)uVar1,"bcast n");
      ref_dict_local._4_4_ = uVar1;
    }
  }
  return ref_dict_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_dict_bcast(REF_DICT ref_dict, REF_MPI ref_mpi) {
  REF_INT n;
  REF_INT *keys, *values;
  REF_INT i, index, key, value;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  if (ref_mpi_once(ref_mpi)) {
    n = ref_dict_n(ref_dict);
  }
  RSS(ref_mpi_bcast(ref_mpi, &n, 1, REF_INT_TYPE), "bcast n");
  ref_malloc(keys, n, REF_INT);
  ref_malloc(values, n, REF_INT);
  if (ref_mpi_once(ref_mpi)) {
    each_ref_dict_key_value(ref_dict, index, key, value) {
      keys[index] = key;
      values[index] = value;
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, keys, n, REF_INT_TYPE), "bcast keys");
  RSS(ref_mpi_bcast(ref_mpi, values, n, REF_INT_TYPE), "bcast values");
  if (!ref_mpi_once(ref_mpi)) {
    for (i = 0; i < n; i++) {
      RSS(ref_dict_store(ref_dict, keys[i], values[i]), "store");
    }
  }
  ref_free(values);
  ref_free(keys);
  return REF_SUCCESS;
}